

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O2

Value __thiscall
MiniScript::Parser::ParseExpr(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  undefined7 in_register_00000011;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  Value VVar1;
  Lexer local_10;
  
  local_10.ls = *(LexerStorage **)CONCAT71(in_register_00000011,asLval);
  if (local_10.ls != (LexerStorage *)0x0) {
    (local_10.ls)->refCount = (local_10.ls)->refCount + 1;
  }
  ParseFunction(this,tokens,SUB81(&local_10,0),statementStart);
  Lexer::release(&local_10);
  VVar1.data.number = extraout_RDX.number;
  VVar1._0_8_ = this;
  return VVar1;
}

Assistant:

Value Parser::ParseExpr(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseFunction;
		return (*this.*nextLevel)(tokens, asLval, statementStart);
	}